

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_context.cpp
# Opt level: O0

void __thiscall
jessilib::impl::timer_context::timer_context
          (timer_context *this,duration_t in_period,function_t *in_callback)

{
  timer_manager *ptVar1;
  iterator iVar2;
  rep rVar3;
  function_t *in_callback_local;
  timer_context *this_local;
  duration_t in_period_local;
  
  std::enable_shared_from_this<jessilib::impl::timer_context>::enable_shared_from_this
            (&this->super_enable_shared_from_this<jessilib::impl::timer_context>);
  (this->m_period).__r = in_period.__r;
  std::function<void_(jessilib::timer_&)>::function(&this->m_callback,in_callback);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->m_next);
  ptVar1 = timer_manager::instance();
  iVar2 = std::__cxx11::
          list<std::shared_ptr<jessilib::impl::timer_context>,_std::allocator<std::shared_ptr<jessilib::impl::timer_context>_>_>
          ::end(&ptVar1->m_detached_timers);
  (this->m_self)._M_node = iVar2._M_node;
  std::shared_mutex::shared_mutex(&this->m_mutex);
  rVar3 = std::chrono::_V2::steady_clock::now();
  (this->m_last_fire_finish).__d.__r = rVar3;
  return;
}

Assistant:

timer_context::timer_context(duration_t in_period, function_t in_callback)
	: m_period{ in_period },
	// m_next{ calc_next() },
	m_callback{ std::move(in_callback) },
	m_self{ timer_manager::instance().m_detached_timers.end() },
	m_last_fire_finish{ std::chrono::steady_clock::now() } {
	// Empty ctor body
}